

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Detail::BasicResult<Catch::Clara::ParseResultType>::BasicResult
          (BasicResult<Catch::Clara::ParseResultType> *this,
          BasicResult<Catch::Clara::ParseResultType> *param_2)

{
  long in_RSI;
  ResultValueBase<Catch::Clara::ParseResultType> *in_RDI;
  ResultValueBase<Catch::Clara::ParseResultType> *in_stack_ffffffffffffffe0;
  
  ResultValueBase<Catch::Clara::ParseResultType>::ResultValueBase(in_stack_ffffffffffffffe0,in_RDI);
  (in_RDI->super_ResultBase)._vptr_ResultBase = (_func_int **)&PTR__BasicResult_002a9420;
  std::__cxx11::string::string((string *)(in_RDI + 1),(string *)(in_RSI + 0x10));
  return;
}

Assistant:

explicit BasicResult( BasicResult<U> const& other ):
                    ResultValueBase<T>( other.type() ),
                    m_errorMessage( other.errorMessage() ) {
                    assert( type() != ResultType::Ok );
                }